

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O1

Matrix33<float> * __thiscall
Imath_3_2::Matrix33<float>::inverse
          (Matrix33<float> *__return_storage_ptr__,Matrix33<float> *this,bool singExc)

{
  float fVar1;
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  invalid_argument *this_00;
  int i;
  long lVar10;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  bool bVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float fStack_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  float local_18;
  
  pfVar7 = &local_38;
  pfVar8 = &local_38;
  pfVar9 = &local_38;
  fVar15 = this->x[0][2];
  if ((((fVar15 != 0.0) || (NAN(fVar15))) || (fVar16 = this->x[1][2], fVar16 != 0.0)) ||
     (((NAN(fVar16) || (fVar16 = this->x[2][2], fVar16 != 1.0)) || (NAN(fVar16))))) {
    fVar16 = this->x[1][1];
    fVar19 = this->x[0][0];
    fVar20 = this->x[0][1];
    fVar3 = this->x[1][2];
    fVar4 = this->x[2][0];
    fVar5 = this->x[2][1];
    fVar6 = this->x[2][2];
    fVar1 = this->x[1][0];
    local_38 = fVar16 * fVar6 - fVar3 * fVar5;
    fStack_2c = fVar3 * fVar4 - fVar6 * fVar1;
    fStack_34 = fVar15 * fVar5 - fVar6 * fVar20;
    fStack_30 = fVar20 * fVar3 - fVar15 * fVar16;
    fStack_20 = fVar5 * fVar1 - fVar16 * fVar4;
    fStack_1c = fVar4 * fVar20 - fVar5 * fVar19;
    fStack_28 = fVar6 * fVar19 - fVar15 * fVar4;
    fStack_24 = fVar15 * fVar1 - fVar3 * fVar19;
    local_18 = fVar19 * fVar16 + -fVar1 * fVar20;
    fVar15 = fStack_20 * fVar15 + fStack_2c * fVar20 + fVar19 * local_38;
    auVar18._4_4_ = fStack_1c;
    auVar18._0_4_ = fVar15;
    auVar18._8_4_ = fStack_20;
    auVar18._12_4_ = fStack_1c;
    if (fVar15 <= -fVar15) {
      auVar18._0_4_ = -fVar15;
    }
    if (1.0 <= auVar18._0_4_) {
      lVar12 = 0;
      do {
        lVar10 = 0;
        do {
          *(float *)((long)pfVar8 + lVar10 * 4) = *(float *)((long)pfVar8 + lVar10 * 4) / fVar15;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 3);
        lVar12 = lVar12 + 1;
        pfVar8 = (float *)((long)pfVar8 + 0xc);
      } while (lVar12 != 3);
    }
    else {
      uVar11 = 0;
      bVar13 = false;
      do {
        lVar12 = 0;
        do {
          fVar16 = *(float *)((long)pfVar7 + lVar12 * 4);
          fVar19 = fVar16;
          if (fVar16 <= -fVar16) {
            fVar19 = -fVar16;
          }
          if (auVar18._0_4_ * 8.507059e+37 <= fVar19) {
            if (singExc) {
              this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument(this_00,"Cannot invert singular matrix.");
              goto LAB_0014988f;
            }
            *(float *)((long)(__return_storage_ptr__->x + 0) + 0) = 1.0;
            *(float *)((long)(__return_storage_ptr__->x + 0) + 4) = 0.0;
            *(undefined8 *)(__return_storage_ptr__->x[0] + 2) = 0;
            *(float *)((long)(__return_storage_ptr__->x + 1) + 4) = 1.0;
            *(float *)((long)(__return_storage_ptr__->x + 1) + 8) = 0.0;
            *(float *)((long)(__return_storage_ptr__->x + 2) + 0) = 0.0;
            *(float *)((long)(__return_storage_ptr__->x + 2) + 4) = 0.0;
            __return_storage_ptr__->x[2][2] = 1.0;
            if (!bVar13) {
              return __return_storage_ptr__;
            }
            goto LAB_001496ec;
          }
          *(float *)((long)pfVar7 + lVar12 * 4) = fVar16 / fVar15;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        bVar13 = 1 < uVar11;
        uVar11 = uVar11 + 1;
        pfVar7 = (float *)((long)pfVar7 + 0xc);
      } while (uVar11 != 3);
    }
LAB_001496ec:
    *(ulong *)__return_storage_ptr__->x[0] = CONCAT44(fStack_34,local_38);
    *(ulong *)(__return_storage_ptr__->x[0] + 2) = CONCAT44(fStack_2c,fStack_30);
    *(ulong *)(__return_storage_ptr__->x[1] + 1) = CONCAT44(fStack_24,fStack_28);
    *(ulong *)__return_storage_ptr__->x[2] = CONCAT44(fStack_1c,fStack_20);
  }
  else {
    local_38 = this->x[1][1];
    fStack_28 = this->x[0][0];
    fVar15 = this->x[0][1];
    fVar16 = this->x[1][0];
    fStack_34 = -fVar15;
    fStack_30 = 0.0;
    fStack_2c = -fVar16;
    fStack_24 = 0.0;
    fStack_20 = 0.0;
    fStack_1c = 0.0;
    local_18 = 1.0;
    fVar16 = fStack_28 * local_38 - fVar15 * fVar16;
    fVar15 = fVar16;
    if (fVar16 <= -fVar16) {
      fVar15 = -fVar16;
    }
    if (1.0 <= fVar15) {
      lVar12 = 0;
      do {
        auVar17._8_8_ = 0;
        auVar17._0_8_ = *(ulong *)((long)&local_38 + lVar12);
        auVar2._4_4_ = fVar16;
        auVar2._0_4_ = fVar16;
        auVar2._8_4_ = fVar16;
        auVar2._12_4_ = fVar16;
        auVar18 = divps(auVar17,auVar2);
        *(long *)((long)&local_38 + lVar12) = auVar18._0_8_;
        lVar12 = lVar12 + 0xc;
      } while (lVar12 == 0xc);
    }
    else {
      bVar13 = false;
      lVar12 = 0;
      do {
        lVar10 = 0;
        do {
          fVar19 = *(float *)((long)pfVar9 + lVar10 * 4);
          fVar20 = fVar19;
          if (fVar19 <= -fVar19) {
            fVar20 = -fVar19;
          }
          if (fVar15 * 8.507059e+37 <= fVar20) {
            if (singExc) {
              this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument(this_00,"Cannot invert singular matrix.");
LAB_0014988f:
              __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                          std::invalid_argument::~invalid_argument);
            }
            *(float *)((long)(__return_storage_ptr__->x + 0) + 0) = 1.0;
            *(float *)((long)(__return_storage_ptr__->x + 0) + 4) = 0.0;
            *(undefined8 *)(__return_storage_ptr__->x[0] + 2) = 0;
            *(float *)((long)(__return_storage_ptr__->x + 1) + 4) = 1.0;
            *(float *)((long)(__return_storage_ptr__->x + 1) + 8) = 0.0;
            *(float *)((long)(__return_storage_ptr__->x + 2) + 0) = 0.0;
            *(float *)((long)(__return_storage_ptr__->x + 2) + 4) = 0.0;
            __return_storage_ptr__->x[2][2] = 1.0;
            if (!bVar13) {
              return __return_storage_ptr__;
            }
            goto LAB_0014981a;
          }
          *(float *)((long)pfVar9 + lVar10 * 4) = fVar19 / fVar16;
          lVar10 = lVar10 + 1;
        } while (lVar10 == 1);
        pfVar9 = (float *)((long)pfVar9 + 0xc);
        bVar14 = lVar12 == 0;
        bVar13 = !bVar14;
        lVar12 = lVar12 + 1;
      } while (bVar14);
    }
LAB_0014981a:
    fVar15 = this->x[2][0];
    fVar16 = this->x[2][1];
    *(ulong *)__return_storage_ptr__->x[0] = CONCAT44(fStack_34,local_38);
    __return_storage_ptr__->x[0][2] = fStack_30;
    *(ulong *)__return_storage_ptr__->x[1] = CONCAT44(fStack_28,fStack_2c);
    __return_storage_ptr__->x[1][2] = fStack_24;
    *(ulong *)__return_storage_ptr__->x[2] =
         CONCAT44(-fVar15 * fStack_34 - fVar16 * fStack_28,-fVar15 * local_38 - fVar16 * fStack_2c);
  }
  __return_storage_ptr__->x[2][2] = local_18;
  return __return_storage_ptr__;
}

Assistant:

IMATH_CONSTEXPR14 inline Matrix33<T>
Matrix33<T>::inverse (bool singExc) const
{
    if (x[0][2] != 0 || x[1][2] != 0 || x[2][2] != 1)
    {
        Matrix33 s (
            x[1][1] * x[2][2] - x[2][1] * x[1][2],
            x[2][1] * x[0][2] - x[0][1] * x[2][2],
            x[0][1] * x[1][2] - x[1][1] * x[0][2],

            x[2][0] * x[1][2] - x[1][0] * x[2][2],
            x[0][0] * x[2][2] - x[2][0] * x[0][2],
            x[1][0] * x[0][2] - x[0][0] * x[1][2],

            x[1][0] * x[2][1] - x[2][0] * x[1][1],
            x[2][0] * x[0][1] - x[0][0] * x[2][1],
            x[0][0] * x[1][1] - x[1][0] * x[0][1]);

        T r = x[0][0] * s[0][0] + x[0][1] * s[1][0] + x[0][2] * s[2][0];

        if (IMATH_INTERNAL_NAMESPACE::abs (r) >= 1)
        {
            for (int i = 0; i < 3; ++i)
            {
                for (int j = 0; j < 3; ++j)
                {
                    s.x[i][j] /= r;
                }
            }
        }
        else
        {
            T mr = IMATH_INTERNAL_NAMESPACE::abs (r) /
                   std::numeric_limits<T>::min ();

            for (int i = 0; i < 3; ++i)
            {
                for (int j = 0; j < 3; ++j)
                {
                    if (mr > IMATH_INTERNAL_NAMESPACE::abs (s.x[i][j]))
                    {
                        s.x[i][j] /= r;
                    }
                    else
                    {
                        if (singExc)
                            throw std::invalid_argument ("Cannot invert "
                                                         "singular matrix.");
                        return Matrix33 ();
                    }
                }
            }
        }

        return s;
    }
    else
    {
        Matrix33 s (
            x[1][1],
            -x[0][1],
            0,

            -x[1][0],
            x[0][0],
            0,

            0,
            0,
            1);

        T r = x[0][0] * x[1][1] - x[1][0] * x[0][1];

        if (IMATH_INTERNAL_NAMESPACE::abs (r) >= 1)
        {
            for (int i = 0; i < 2; ++i)
            {
                for (int j = 0; j < 2; ++j)
                {
                    s.x[i][j] /= r;
                }
            }
        }
        else
        {
            T mr = IMATH_INTERNAL_NAMESPACE::abs (r) /
                   std::numeric_limits<T>::min ();

            for (int i = 0; i < 2; ++i)
            {
                for (int j = 0; j < 2; ++j)
                {
                    if (mr > IMATH_INTERNAL_NAMESPACE::abs (s.x[i][j]))
                    {
                        s.x[i][j] /= r;
                    }
                    else
                    {
                        if (singExc)
                            throw std::invalid_argument ("Cannot invert "
                                                         "singular matrix.");
                        return Matrix33 ();
                    }
                }
            }
        }

        s.x[2][0] = -x[2][0] * s.x[0][0] - x[2][1] * s.x[1][0];
        s.x[2][1] = -x[2][0] * s.x[0][1] - x[2][1] * s.x[1][1];

        return s;
    }
}